

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

aiString * __thiscall
Assimp::ColladaLoader::FindFilenameForEffectTexture
          (aiString *__return_storage_ptr__,ColladaLoader *this,ColladaParser *pParser,
          Effect *pEffect,string *pName)

{
  _Base_ptr p_Var1;
  void *__src;
  uint uVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  aiTexture *paVar5;
  Logger *pLVar6;
  aiTexel *__dest;
  DeadlyImportError *this_00;
  ColladaLoader *this_01;
  ColladaLoader *__dest_00;
  string name;
  char *local_1c8 [4];
  aiTexture *tex;
  ulong local_1a0;
  
  __return_storage_ptr__->length = 0;
  __dest_00 = (ColladaLoader *)__return_storage_ptr__->data;
  __return_storage_ptr__->data[0] = '\0';
  memset(__return_storage_ptr__->data + 1,0x1b,0x3ff);
  std::__cxx11::string::string((string *)&name,(string *)pName);
  while( true ) {
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>_>
            ::find(&(pEffect->mParams)._M_t,&name);
    if ((_Rb_tree_header *)cVar3._M_node == &(pEffect->mParams)._M_t._M_impl.super__Rb_tree_header)
    break;
    std::__cxx11::string::_M_assign((string *)&name);
  }
  this_01 = (ColladaLoader *)&pParser->mImageLibrary;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                  *)this_01,&name);
  if ((_Rb_tree_header *)cVar4._M_node ==
      &(pParser->mImageLibrary)._M_t._M_impl.super__Rb_tree_header) {
    pLVar6 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[50]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&tex,
               (char (*) [50])"Collada: Unable to resolve effect texture entry \"");
    std::operator<<((ostream *)&tex,(string *)pName);
    std::operator<<((ostream *)&tex,"\", ended up at ID \"");
    std::operator<<((ostream *)&tex,(string *)&name);
    std::operator<<((ostream *)&tex,"\".");
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar6,local_1c8[0]);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tex);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tex,&name,
                   ".jpg");
    if (local_1a0 < 0x400) {
      __return_storage_ptr__->length = (ai_uint32)local_1a0;
      memcpy(__dest_00,tex,local_1a0);
      __return_storage_ptr__->data[local_1a0] = '\0';
    }
    this_01 = (ColladaLoader *)&tex;
    std::__cxx11::string::~string((string *)this_01);
  }
  else {
    if (*(_Base_ptr *)(cVar4._M_node + 3) != cVar4._M_node[3]._M_parent) {
      paVar5 = (aiTexture *)operator_new(0x428);
      paVar5->mWidth = 0;
      paVar5->mHeight = 0;
      paVar5->pcData = (aiTexel *)0x0;
      (paVar5->mFilename).length = 0;
      (paVar5->mFilename).data[0] = '\0';
      memset((paVar5->mFilename).data + 1,0x1b,0x3ff);
      paVar5->achFormatHint[0] = '\0';
      paVar5->achFormatHint[1] = '\0';
      paVar5->achFormatHint[2] = '\0';
      paVar5->achFormatHint[3] = '\0';
      tex = paVar5;
      aiString::Set(&paVar5->mFilename,*(char **)(cVar4._M_node + 2));
      p_Var1 = cVar4._M_node[2]._M_parent;
      if (p_Var1 < (_Base_ptr)0x400) {
        __return_storage_ptr__->length = (ai_uint32)p_Var1;
        memcpy(__dest_00,*(void **)(cVar4._M_node + 2),(size_t)p_Var1);
        __return_storage_ptr__->data[(long)p_Var1] = '\0';
      }
      if (3 < *(ulong *)(cVar4._M_node + 4)) {
        pLVar6 = DefaultLogger::get();
        Logger::warn(pLVar6,"Collada: texture format hint is too long, truncating to 3 characters");
      }
      strncpy(paVar5->achFormatHint,(char *)cVar4._M_node[3]._M_right,3);
      paVar5->mHeight = 0;
      __src = *(void **)(cVar4._M_node + 3);
      uVar2 = (int)cVar4._M_node[3]._M_parent - (int)__src;
      paVar5->mWidth = uVar2;
      __dest = (aiTexel *)operator_new__((ulong)uVar2);
      paVar5->pcData = __dest;
      memcpy(__dest,__src,(ulong)uVar2);
      std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::push_back(&this->mTextures,&tex);
      goto LAB_003e14e5;
    }
    p_Var1 = cVar4._M_node[2]._M_parent;
    if (p_Var1 == (_Base_ptr)0x0) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&tex,"Collada: Invalid texture, no data or file reference given",
                 (allocator *)local_1c8);
      DeadlyImportError::DeadlyImportError(this_00,(string *)&tex);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (p_Var1 < (_Base_ptr)0x400) {
      __return_storage_ptr__->length = (ai_uint32)p_Var1;
      memcpy(__dest_00,*(void **)(cVar4._M_node + 2),(size_t)p_Var1);
      __return_storage_ptr__->data[(long)p_Var1] = '\0';
      this_01 = __dest_00;
    }
  }
  ConvertPath(this_01,__return_storage_ptr__);
LAB_003e14e5:
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

aiString ColladaLoader::FindFilenameForEffectTexture(const ColladaParser& pParser,
    const Collada::Effect& pEffect, const std::string& pName)
{
    aiString result;

    // recurse through the param references until we end up at an image
    std::string name = pName;
    while (1)
    {
        // the given string is a param entry. Find it
        Collada::Effect::ParamLibrary::const_iterator it = pEffect.mParams.find(name);
        // if not found, we're at the end of the recursion. The resulting string should be the image ID
        if (it == pEffect.mParams.end())
            break;

        // else recurse on
        name = it->second.mReference;
    }

    // find the image referred by this name in the image library of the scene
    ColladaParser::ImageLibrary::const_iterator imIt = pParser.mImageLibrary.find(name);
    if (imIt == pParser.mImageLibrary.end())
    {
        ASSIMP_LOG_WARN_F("Collada: Unable to resolve effect texture entry \"", pName, "\", ended up at ID \"", name, "\".");

        //set default texture file name
        result.Set(name + ".jpg");
        ConvertPath(result);
        return result;
    }

    // if this is an embedded texture image setup an aiTexture for it
    if (!imIt->second.mImageData.empty())
    {
        aiTexture* tex = new aiTexture();

        // Store embedded texture name reference
        tex->mFilename.Set(imIt->second.mFileName.c_str());
        result.Set(imIt->second.mFileName);

        // TODO: check the possibility of using the flag "AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING"
//        result.data[0] = '*';
//        result.length = 1 + ASSIMP_itoa10(result.data + 1, static_cast<unsigned int>(MAXLEN - 1), static_cast<int32_t>(mTextures.size()));


        // setup format hint
        if (imIt->second.mEmbeddedFormat.length() > 3) {
            ASSIMP_LOG_WARN("Collada: texture format hint is too long, truncating to 3 characters");
        }
        strncpy(tex->achFormatHint, imIt->second.mEmbeddedFormat.c_str(), 3);

        // and copy texture data
        tex->mHeight = 0;
        tex->mWidth = static_cast<unsigned int>(imIt->second.mImageData.size());
        tex->pcData = (aiTexel*)new char[tex->mWidth];
        memcpy(tex->pcData, &imIt->second.mImageData[0], tex->mWidth);

        // and add this texture to the list
        mTextures.push_back(tex);
    }
    else
    {
        if (imIt->second.mFileName.empty()) {
            throw DeadlyImportError("Collada: Invalid texture, no data or file reference given");
        }

        result.Set(imIt->second.mFileName);
        ConvertPath(result);
    }
    return result;
}